

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

void __thiscall
duckdb_jaro_winkler::common::PatternMatchVector::insert<char_const*>
          (PatternMatchVector *this,char *first,char *last)

{
  uint64_t uVar1;
  MapElem *pMVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  uint64_t key;
  long lVar5;
  
  if (0 < (long)last - (long)first) {
    uVar4 = 1;
    lVar5 = 0;
    do {
      key = (uint64_t)first[lVar5];
      if ((long)key < 0) {
        uVar1 = BitvectorHashmap::lookup(&this->m_map,key);
        pMVar2 = (this->m_map).m_map._M_elems + uVar1;
        puVar3 = &pMVar2->value;
        pMVar2->key = key;
      }
      else {
        puVar3 = (this->m_extendedAscii)._M_elems + key;
      }
      *puVar3 = *puVar3 | uVar4;
      uVar4 = uVar4 * 2;
      lVar5 = lVar5 + 1;
    } while ((long)last - (long)first != lVar5);
  }
  return;
}

Assistant:

void insert(InputIt1 first, InputIt1 last)
    {
        uint64_t mask = 1;
        for (int64_t i = 0; i < std::distance(first, last); ++i) {
            auto key = first[i];
            if (key >= 0 && key <= 255) {
                m_extendedAscii[static_cast<size_t>(key)] |= mask;
            }
            else {
                m_map.insert_mask(key, mask);
            }
            mask <<= 1;
        }
    }